

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall TArray<side_t,_side_t>::Push(TArray<side_t,_side_t> *this,side_t *item)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  side_t *psVar4;
  DBaseDecal *pDVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  line_t_conflict *plVar9;
  side_t *psVar10;
  WORD WVar11;
  SWORD SVar12;
  BYTE BVar13;
  undefined3 uVar14;
  int iVar15;
  DWORD DVar16;
  DWORD DVar17;
  long lVar18;
  
  Grow(this,1);
  psVar4 = this->Array;
  uVar3 = this->Count;
  pDVar5 = item->AttachedDecals;
  psVar4[uVar3].sector = item->sector;
  psVar4[uVar3].AttachedDecals = pDVar5;
  lVar18 = 0x38;
  do {
    *(undefined4 *)((long)psVar4[uVar3].textures + lVar18 + -0x18) =
         *(undefined4 *)((long)item->textures + lVar18 + -0x18);
    puVar1 = (undefined8 *)((long)item->textures + lVar18 + -0x38);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)item->textures + lVar18 + -0x28);
    uVar8 = puVar1[1];
    puVar2 = (undefined8 *)((long)psVar4[uVar3].textures + lVar18 + -0x28);
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
    puVar1 = (undefined8 *)((long)psVar4[uVar3].textures + lVar18 + -0x38);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    *(undefined8 *)((long)psVar4[uVar3].textures + lVar18 + -0x10) =
         *(undefined8 *)((long)item->textures + lVar18 + -0x10);
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 200);
  plVar9 = item->linedef;
  DVar16 = item->LeftSide;
  DVar17 = item->RightSide;
  WVar11 = item->TexelLength;
  SVar12 = item->Light;
  BVar13 = item->Flags;
  uVar14 = *(undefined3 *)&item->field_0xb5;
  iVar15 = item->Index;
  psVar10 = psVar4 + uVar3;
  psVar10->RightSide = item->RightSide;
  psVar10->TexelLength = WVar11;
  psVar10->Light = SVar12;
  psVar10 = psVar4 + uVar3;
  psVar10->Flags = BVar13;
  *(undefined3 *)&psVar10->field_0xb5 = uVar14;
  psVar10->Index = iVar15;
  psVar4[uVar3].linedef = plVar9;
  psVar4[uVar3].LeftSide = DVar16;
  psVar4[uVar3].RightSide = DVar17;
  uVar3 = this->Count;
  this->Count = uVar3 + 1;
  return uVar3;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}